

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventFactory.cpp
# Opt level: O3

IEvent * tiger::trains::world::EventFactory::createEvent(EventModel *model,Train *source)

{
  EventType EVar1;
  TrainCollisionEven *this;
  World *world;
  
  EVar1 = models::EventModel::getType(model);
  if (EVar1 == TRAIN_COLLISION) {
    this = (TrainCollisionEven *)operator_new(0x28);
    events::TrainCollisionEven::TrainCollisionEven(this,model,source);
  }
  else {
    this = (TrainCollisionEven *)operator_new(0x18);
    world = Train::getWorld(source);
    events::BaseEvent::BaseEvent((BaseEvent *)this,model,world);
  }
  return (IEvent *)this;
}

Assistant:

IEvent *EventFactory::createEvent(const models::EventModel &model, Train *source)
{
    switch (model.getType())
    {

    case models::EventType::TRAIN_COLLISION:
        return new events::TrainCollisionEven(model, source);

    default:
        return new events::BaseEvent(model, source->getWorld());
    }
}